

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triangle.cpp
# Opt level: O3

Vector3d * __thiscall OpenMD::Triangle::computeNormal(Triangle *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  Vector3d *in_RDI;
  
  this->HaveNormal_ = true;
  dVar1 = (this->b_).super_Vector<double,_3U>.data_[0];
  dVar2 = (this->a_).super_Vector<double,_3U>.data_[0];
  dVar3 = (this->a_).super_Vector<double,_3U>.data_[1];
  dVar4 = (this->a_).super_Vector<double,_3U>.data_[2];
  dVar5 = (this->b_).super_Vector<double,_3U>.data_[1];
  dVar6 = (this->b_).super_Vector<double,_3U>.data_[2];
  (this->normal_).super_Vector<double,_3U>.data_[0] = dVar6 * dVar3 - dVar4 * dVar5;
  (this->normal_).super_Vector<double,_3U>.data_[1] = dVar1 * dVar4 - dVar2 * dVar6;
  (this->normal_).super_Vector<double,_3U>.data_[2] = dVar2 * dVar5 - dVar3 * dVar1;
  (in_RDI->super_Vector<double,_3U>).data_[0] = 0.0;
  (in_RDI->super_Vector<double,_3U>).data_[1] = 0.0;
  (in_RDI->super_Vector<double,_3U>).data_[2] = 0.0;
  if (&this->normal_ != in_RDI) {
    (in_RDI->super_Vector<double,_3U>).data_[2] = (this->normal_).super_Vector<double,_3U>.data_[2];
    dVar1 = (this->normal_).super_Vector<double,_3U>.data_[1];
    (in_RDI->super_Vector<double,_3U>).data_[0] = (this->normal_).super_Vector<double,_3U>.data_[0];
    (in_RDI->super_Vector<double,_3U>).data_[1] = dVar1;
  }
  return in_RDI;
}

Assistant:

Vector3d Triangle::computeNormal() {
  HaveNormal_ = true;
  normal_     = cross(a_, b_);
  return normal_;
}